

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib540.c
# Opt level: O1

int loop(int num,CURLM *cm,char *url,char *userpwd,curl_slist *headers)

{
  bool bVar1;
  CURLM *pCVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  CURL *pCVar8;
  undefined8 uVar9;
  long lVar10;
  int *piVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  timeval tVar16;
  timeval older;
  timeval older_00;
  int U;
  int M;
  int Q;
  long L;
  timeval T;
  fd_set E;
  fd_set W;
  fd_set R;
  int local_1f0;
  int local_1ec;
  CURLM *local_1e8;
  undefined1 local_1dc [4];
  long local_1d8;
  timeval local_1d0;
  curl_slist *local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  uVar14 = (ulong)(uint)num;
  local_1f0 = -1;
  local_1e8 = (CURLM *)userpwd;
  local_1c0 = headers;
  pCVar8 = (CURL *)curl_easy_init();
  eh[uVar14] = pCVar8;
  if (pCVar8 == (CURL *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                  ,0x36);
    iVar7 = 0x7c;
    uVar15 = 0;
  }
  else {
    iVar5 = curl_easy_setopt(eh[uVar14],0x2712,url);
    uVar3 = _stderr;
    iVar7 = 0;
    if (iVar5 != 0) {
      uVar9 = curl_easy_strerror(iVar5);
      curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                    ,0x3a,iVar5,uVar9);
      iVar7 = iVar5;
    }
    uVar15 = uVar14;
    if (iVar7 == 0) {
      iVar5 = curl_easy_setopt(eh[uVar14],0x2714,libtest_arg2);
      uVar3 = _stderr;
      iVar7 = 0;
      if (iVar5 != 0) {
        uVar9 = curl_easy_strerror(iVar5);
        curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                      ,0x3e,iVar5,uVar9);
        iVar7 = iVar5;
      }
      if (iVar7 == 0) {
        iVar5 = curl_easy_setopt(eh[uVar14],0x2716,local_1e8);
        uVar3 = _stderr;
        iVar7 = 0;
        if (iVar5 != 0) {
          uVar9 = curl_easy_strerror(iVar5);
          curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                        ,0x42,iVar5,uVar9);
          iVar7 = iVar5;
        }
        if (iVar7 == 0) {
          iVar5 = curl_easy_setopt(eh[uVar14],0x6f,0xffffffffffffffef);
          uVar3 = _stderr;
          iVar7 = 0;
          if (iVar5 != 0) {
            uVar9 = curl_easy_strerror(iVar5);
            curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                          ,0x46,iVar5,uVar9);
            iVar7 = iVar5;
          }
          if (iVar7 == 0) {
            iVar5 = curl_easy_setopt(eh[uVar14],0x29,1);
            uVar3 = _stderr;
            iVar7 = 0;
            if (iVar5 != 0) {
              uVar9 = curl_easy_strerror(iVar5);
              curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                            ,0x4a,iVar5,uVar9);
              iVar7 = iVar5;
            }
            if (iVar7 == 0) {
              iVar5 = curl_easy_setopt(eh[uVar14],0x2a,1);
              uVar3 = _stderr;
              iVar7 = 0;
              if (iVar5 != 0) {
                uVar9 = curl_easy_strerror(iVar5);
                curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                              ,0x4e,iVar5,uVar9);
                iVar7 = iVar5;
              }
              if (iVar7 == 0) {
                iVar5 = curl_easy_setopt(eh[uVar14],0x2727,local_1c0);
                uVar3 = _stderr;
                iVar7 = 0;
                if (iVar5 != 0) {
                  uVar9 = curl_easy_strerror(iVar5);
                  curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                ,0x52,iVar5,uVar9);
                  iVar7 = iVar5;
                }
                if (iVar7 == 0) {
                  iVar5 = curl_multi_add_handle(cm,eh[uVar14]);
                  uVar3 = _stderr;
                  iVar7 = 0;
                  if (iVar5 != 0) {
                    uVar9 = curl_multi_strerror(iVar5);
                    curl_mfprintf(uVar3,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                  ,0x56,iVar5,uVar9);
                    iVar7 = iVar5;
                  }
                  iVar5 = 0;
                  if (iVar7 == 0) goto LAB_00102831;
                }
              }
            }
          }
        }
      }
    }
  }
  curl_easy_cleanup(eh[uVar14]);
  eh[uVar14] = (CURL *)0x0;
  iVar5 = iVar7;
LAB_00102831:
  if (iVar5 == 0) {
    uVar14 = 0;
    local_1e8 = cm;
    do {
      if (local_1f0 == 0) {
        return 0;
      }
      local_1ec = -99;
      uVar6 = curl_multi_perform(local_1e8,&local_1f0);
      uVar3 = _stderr;
      if (uVar6 == 0) {
        if (local_1f0 < 0) {
          curl_mfprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                        ,0x76);
          uVar14 = 0x7a;
        }
      }
      else {
        uVar14 = (ulong)uVar6;
        uVar9 = curl_multi_strerror(uVar14);
        curl_mfprintf(uVar3,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                      ,0x76,uVar6,uVar9);
      }
      bVar1 = false;
      uVar4 = uVar14;
      if ((int)uVar14 == 0) {
        tVar16 = tutil_tvnow();
        older.tv_usec = tv_test_start.tv_usec;
        older.tv_sec = tv_test_start.tv_sec;
        lVar10 = tutil_tvdiff(tVar16,older);
        if (lVar10 < 0xea61) {
          pCVar2 = local_1e8;
          if (local_1f0 == 0) {
LAB_00102c25:
            piVar11 = (int *)curl_multi_info_read(pCVar2,local_1dc);
            uVar3 = _stderr;
            if (piVar11 != (int *)0x0) {
              if (*piVar11 == 1) {
                lVar10 = *(long *)(piVar11 + 2);
                iVar7 = piVar11[4];
                uVar9 = curl_easy_strerror(iVar7);
                curl_mfprintf(uVar3,"R: %d - %s\n",iVar7,uVar9);
                curl_multi_remove_handle(pCVar2,lVar10);
                curl_easy_cleanup(lVar10);
                lVar13 = 0;
                do {
                  if (*(long *)((long)eh + lVar13) == lVar10) {
                    *(undefined8 *)((long)eh + lVar13) = 0;
                    break;
                  }
                  lVar13 = lVar13 + 8;
                } while (lVar13 == 8);
              }
              else {
                curl_mfprintf(_stderr,"E: CURLMsg (%d)\n");
              }
              goto LAB_00102c25;
            }
            tVar16 = tutil_tvnow();
            older_00.tv_usec = tv_test_start.tv_usec;
            older_00.tv_sec = tv_test_start.tv_sec;
            lVar10 = tutil_tvdiff(tVar16,older_00);
            uVar14 = 0;
            bVar1 = lVar10 < 0xea61;
            uVar4 = uVar15;
            if (60000 < lVar10) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                            ,0xb1);
              uVar14 = 0x7d;
              uVar4 = 0x7d;
            }
          }
          else {
            local_b8.__fds_bits[0xe] = 0;
            local_b8.__fds_bits[0xf] = 0;
            local_b8.__fds_bits[0xc] = 0;
            local_b8.__fds_bits[0xd] = 0;
            local_b8.__fds_bits[10] = 0;
            local_b8.__fds_bits[0xb] = 0;
            local_b8.__fds_bits[8] = 0;
            local_b8.__fds_bits[9] = 0;
            local_b8.__fds_bits[6] = 0;
            local_b8.__fds_bits[7] = 0;
            local_b8.__fds_bits[4] = 0;
            local_b8.__fds_bits[5] = 0;
            local_b8.__fds_bits[2] = 0;
            local_b8.__fds_bits[3] = 0;
            local_b8.__fds_bits[0] = 0;
            local_b8.__fds_bits[1] = 0;
            local_138.__fds_bits[0] = 0;
            local_138.__fds_bits[1] = 0;
            local_138.__fds_bits[2] = 0;
            local_138.__fds_bits[3] = 0;
            local_138.__fds_bits[4] = 0;
            local_138.__fds_bits[5] = 0;
            local_138.__fds_bits[6] = 0;
            local_138.__fds_bits[7] = 0;
            local_138.__fds_bits[8] = 0;
            local_138.__fds_bits[9] = 0;
            local_138.__fds_bits[10] = 0;
            local_138.__fds_bits[0xb] = 0;
            local_138.__fds_bits[0xc] = 0;
            local_138.__fds_bits[0xd] = 0;
            local_138.__fds_bits[0xe] = 0;
            local_138.__fds_bits[0xf] = 0;
            local_1b8.__fds_bits[0] = 0;
            local_1b8.__fds_bits[1] = 0;
            local_1b8.__fds_bits[2] = 0;
            local_1b8.__fds_bits[3] = 0;
            local_1b8.__fds_bits[4] = 0;
            local_1b8.__fds_bits[5] = 0;
            local_1b8.__fds_bits[6] = 0;
            local_1b8.__fds_bits[7] = 0;
            local_1b8.__fds_bits[8] = 0;
            local_1b8.__fds_bits[9] = 0;
            local_1b8.__fds_bits[10] = 0;
            local_1b8.__fds_bits[0xb] = 0;
            local_1b8.__fds_bits[0xc] = 0;
            local_1b8.__fds_bits[0xd] = 0;
            local_1b8.__fds_bits[0xe] = 0;
            local_1b8.__fds_bits[0xf] = 0;
            uVar6 = curl_multi_fdset(local_1e8,&local_b8,&local_138,&local_1b8,&local_1ec);
            uVar3 = _stderr;
            if (uVar6 == 0) {
              uVar14 = 0;
              if (local_1ec < -1) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                              ,0x83);
                uVar14 = 0x7a;
              }
            }
            else {
              uVar14 = (ulong)uVar6;
              uVar9 = curl_multi_strerror(uVar6);
              curl_mfprintf(uVar3,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                            ,0x83,uVar6,uVar9);
            }
            if ((int)uVar14 == 0) {
              uVar6 = curl_multi_timeout(local_1e8,&local_1d8);
              uVar3 = _stderr;
              if (uVar6 == 0) {
                uVar14 = 0;
                if (local_1d8 < -1) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                                ,0x89);
                  uVar14 = 0x73;
                }
              }
              else {
                uVar14 = (ulong)uVar6;
                uVar9 = curl_multi_strerror(uVar6);
                curl_mfprintf(uVar3,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                              ,0x89,uVar6,uVar9);
              }
              if ((int)uVar14 == 0) {
                if (local_1d8 == -1) {
                  local_1d0.tv_sec = 5;
                  local_1d0.tv_usec = 0;
                }
                else {
                  lVar10 = local_1d8;
                  if (0x7ffffffe < local_1d8) {
                    lVar10 = 0x7fffffff;
                  }
                  local_1d0.tv_sec = (__time_t)((int)lVar10 / 1000);
                  local_1d0.tv_usec = (__suseconds_t)(((int)lVar10 % 1000) * 1000);
                }
                iVar7 = select_wrapper(local_1ec + 1,&local_b8,&local_138,&local_1b8,&local_1d0);
                pCVar2 = local_1e8;
                if (iVar7 != -1) goto LAB_00102c25;
                piVar11 = __errno_location();
                uVar3 = _stderr;
                iVar7 = *piVar11;
                pcVar12 = strerror(iVar7);
                curl_mfprintf(uVar3,"%s:%d select() failed, with errno %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                              ,0x99,iVar7,pcVar12);
                uVar14 = 0x79;
              }
            }
            bVar1 = false;
            uVar4 = uVar14;
          }
        }
        else {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib540.c"
                        ,0x7a);
          uVar14 = 0x7d;
          bVar1 = false;
          uVar4 = uVar14;
        }
      }
      uVar15 = uVar4;
      iVar5 = (int)uVar15;
    } while (bVar1);
  }
  return iVar5;
}

Assistant:

static int loop(int num, CURLM *cm, const char *url, const char *userpwd,
                struct curl_slist *headers)
{
  CURLMsg *msg;
  long L;
  int Q, U = -1;
  fd_set R, W, E;
  struct timeval T;
  int res = 0;

  res = init(num, cm, url, userpwd, headers);
  if(res)
    return res;

  while(U) {

    int M = -99;

    res_multi_perform(cm, &U);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(U) {
      FD_ZERO(&R);
      FD_ZERO(&W);
      FD_ZERO(&E);

      res_multi_fdset(cm, &R, &W, &E, &M);
      if(res)
        return res;

      /* At this point, M is guaranteed to be greater or equal than -1. */

      res_multi_timeout(cm, &L);
      if(res)
        return res;

      /* At this point, L is guaranteed to be greater or equal than -1. */

      if(L != -1) {
        int itimeout = (L > (long)INT_MAX) ? INT_MAX : (int)L;
        T.tv_sec = itimeout/1000;
        T.tv_usec = (itimeout%1000)*1000;
      }
      else {
        T.tv_sec = 5;
        T.tv_usec = 0;
      }

      res_select_test(M + 1, &R, &W, &E, &T);
      if(res)
        return res;
    }

    while((msg = curl_multi_info_read(cm, &Q)) != NULL) {
      if(msg->msg == CURLMSG_DONE) {
        int i;
        CURL *e = msg->easy_handle;
        fprintf(stderr, "R: %d - %s\n", (int)msg->data.result,
                curl_easy_strerror(msg->data.result));
        curl_multi_remove_handle(cm, e);
        curl_easy_cleanup(e);
        for(i = 0; i < NUM_HANDLES; i++) {
          if(eh[i] == e) {
            eh[i] = NULL;
            break;
          }
        }
      }
      else
        fprintf(stderr, "E: CURLMsg (%d)\n", (int)msg->msg);
    }

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}